

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kxsort.h
# Opt level: O3

void kx::
     radix_sort_core_<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int,kx::RadixTraitsUnsigned<unsigned_int>,2>
               (uint *s,uint *e)

{
  uint uVar1;
  ulong uVar2;
  uint *puVar3;
  uint *puVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  uint *puVar8;
  int i;
  uint *puVar9;
  ulong uVar10;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  last_ [257];
  size_t count [256];
  uint *local_1028 [2];
  long local_1018 [256];
  ulong local_818 [257];
  
  memset(local_1018,0,0x7f8);
  memset(local_818,0,0x800);
  puVar4 = s;
  if (s < e) {
    do {
      local_818[*(byte *)((long)puVar4 + 2)] = local_818[*(byte *)((long)puVar4 + 2)] + 1;
      puVar4 = puVar4 + 1;
    } while (puVar4 < e);
  }
  local_1028[1] = s;
  local_1028[0] = s;
  lVar5 = 0;
  do {
    s = s + local_818[lVar5];
    local_1018[lVar5] = (long)s;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0xff);
  uVar6 = 0;
  do {
    uVar2 = local_818[uVar6];
    puVar4 = local_1028[uVar6];
    if (puVar4 + uVar2 == e) {
      local_1018[uVar6 - 1] = (long)e;
      break;
    }
    puVar9 = (uint *)local_1018[uVar6 - 1];
    while (puVar9 != puVar4 + uVar2) {
      uVar10 = (ulong)(*puVar9 >> 0x10 & 0xff);
      uVar7 = *puVar9;
      if (uVar6 != uVar10) {
        do {
          puVar9 = (uint *)local_1018[uVar10 - 1];
          local_1018[uVar10 - 1] = (long)(puVar9 + 1);
          uVar1 = *puVar9;
          *puVar9 = uVar7;
          uVar10 = (ulong)(uVar1 >> 0x10 & 0xff);
          uVar7 = uVar1;
        } while (uVar6 != uVar10);
        puVar9 = (uint *)local_1018[uVar6 - 1];
        *puVar9 = uVar1;
      }
      puVar9 = puVar9 + 1;
      local_1018[uVar6 - 1] = (long)puVar9;
    }
    uVar6 = uVar6 + 1;
  } while (uVar6 != 0x100);
  lVar5 = 0;
  do {
    if (local_818[lVar5] < 0x41) {
      if (1 < local_818[lVar5]) {
        puVar4 = local_1028[lVar5];
        puVar9 = (uint *)local_1018[lVar5 + -1];
        puVar3 = puVar4;
        while (puVar8 = puVar3, puVar3 = puVar8 + 1, puVar3 < puVar9) {
          uVar7 = puVar8[1];
          if (uVar7 < *puVar8) {
            puVar8[1] = *puVar8;
            for (; (puVar4 < puVar8 && (uVar7 < puVar8[-1])); puVar8 = puVar8 + -1) {
              *puVar8 = puVar8[-1];
            }
            *puVar8 = uVar7;
          }
        }
      }
    }
    else {
      radix_sort_core_<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int,kx::RadixTraitsUnsigned<unsigned_int>,1>
                (local_1028[lVar5],local_1018[lVar5 + -1]);
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x100);
  return;
}

Assistant:

inline void radix_sort_core_(RandomIt s, RandomIt e, RadixTraits radix_traits)
    {
        RandomIt last_[kRadixBin + 1];
        RandomIt *last = last_ + 1;
        size_t count[kRadixBin] = {0};

        for (RandomIt i = s; i < e; ++i) {
            ++count[radix_traits.kth_byte(*i, kWhichByte)];
        }

        last_[0] = last_[1] = s;

        for (int i = 1; i < kRadixBin; ++i) {
            last[i] = last[i-1] + count[i-1];
        }

        for (int i = 0; i < kRadixBin; ++i) {
            RandomIt end = last[i-1] + count[i];
            if (end == e) { last[i] = e; break; }
            while (last[i] != end) {
                ValueType swapper = *last[i];
                int tag = radix_traits.kth_byte(swapper, kWhichByte);
                if (tag != i) {
                    do {
                        std::swap(swapper, *last[tag]++);
                    } while ((tag = radix_traits.kth_byte(swapper, kWhichByte)) != i);
                    *last[i] = swapper;
                }
                ++last[i];
            }
        }

        if (kWhichByte > 0) {
            for (int i = 0; i < kRadixBin; ++i) {
                if (count[i] > kInsertSortThreshold) {
                    radix_sort_core_<RandomIt, ValueType, RadixTraits,
                            (kWhichByte > 0 ? (kWhichByte - 1) : 0)>
                            (last[i-1], last[i], radix_traits);
                } else if (count[i] > 1) {
                    insert_sort_core_<RandomIt, ValueType, RadixTraits>(last[i-1], last[i], radix_traits);
                }
            }
        }
    }